

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.c
# Opt level: O2

sexp_conflict sexp_current_clock_second(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  sexp_conflict psVar1;
  int iVar2;
  timeval tv;
  timezone tz;
  
  iVar2 = gettimeofday((timeval *)&tv,(__timezone_ptr_t)&tz);
  if (iVar2 != 0) {
    psVar1 = (sexp_conflict)sexp_user_exception(ctx,self,"couldn\'t gettimeofday",0x3e);
    return psVar1;
  }
  psVar1 = (sexp_conflict)sexp_make_flonum((double)tv.tv_usec / 1000000.0 + (double)tv.tv_sec,ctx);
  return psVar1;
}

Assistant:

sexp sexp_current_clock_second (sexp ctx, sexp self, sexp_sint_t n) {
#ifdef _WIN32
  ULONGLONG t;
  SYSTEMTIME st;
  FILETIME ft;
  ULARGE_INTEGER uli;
  GetLocalTime(&st);
  (void) SystemTimeToFileTime(&st, &ft);
  /* Convert Win32 FILETIME to UNIX time */
  uli.LowPart = ft.dwLowDateTime;
  uli.HighPart = ft.dwHighDateTime;
  t = uli.QuadPart - (11644473600LL * 10 * 1000 * 1000);
  return sexp_make_flonum(ctx, ((double)t / (10 * 1000 * 1000)));
#elif !defined(PLAN9)
  struct timeval tv;
  struct timezone tz;
  if (gettimeofday(&tv, &tz))
    return sexp_user_exception(ctx, self, "couldn't gettimeofday", SEXP_FALSE);
  return sexp_make_flonum(ctx, tv.tv_sec + tv.tv_usec / 1000000.0);
#else
  time_t res = time(NULL);
  return sexp_make_flonum(ctx, res);
#endif
}